

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::io::anon_unknown_0::TokenizerTest_Errors_DD_Errors_Test::TestBody
          (TokenizerTest_Errors_DD_Errors_Test *this)

{
  ZeroCopyInputStream ZVar1;
  bool bVar2;
  bool bVar3;
  Message *message;
  long lVar4;
  char **ppcVar5;
  long lVar6;
  char *message_00;
  char *in_R9;
  string_view src;
  ScopedTrace gtest_trace_1184;
  AssertHelper local_1a0;
  AssertionResult gtest_ar_;
  TestInputStream input;
  AssertionResult gtest_ar;
  AssertHelper local_120;
  TestErrorCollector error_collector;
  Tokenizer tokenizer;
  
  for (lVar4 = 0; lVar4 != 0x1c; lVar4 = lVar4 + 1) {
    ppcVar5 = (char **)&io::(anonymous_namespace)::kErrorCases;
    for (lVar6 = 0; lVar6 != 8; lVar6 = lVar6 + 1) {
      testing::Message::Message((Message *)&input);
      std::operator<<((ostream *)(input.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream + 2),
                      "kErrorCases case #");
      std::ostream::operator<<
                (input.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream + 2,(int)lVar4);
      std::operator<<((ostream *)(input.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream + 2),
                      ": ");
      ZVar1 = input.super_ZeroCopyInputStream;
      src._M_str = (char *)ppcVar5;
      src._M_len = (&io::(anonymous_namespace)::kErrorCases)[lVar4 * 6];
      absl::lts_20250127::CEscape_abi_cxx11_
                ((string *)&tokenizer,*(lts_20250127 **)(&DAT_01722e08 + lVar4 * 0xc),src);
      std::operator<<((ostream *)(ZVar1._vptr_ZeroCopyInputStream + 2),(string *)&tokenizer);
      std::__cxx11::string::~string((string *)&tokenizer);
      std::operator<<((ostream *)(input.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream + 2),
                      ", ");
      std::operator<<((ostream *)(input.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream + 2),
                      "kBlockSizes case #");
      std::ostream::operator<<
                (input.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream + 2,(int)lVar6);
      std::operator<<((ostream *)(input.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream + 2),
                      ": ");
      message = testing::Message::operator<<
                          ((Message *)&input,&io::(anonymous_namespace)::kBlockSizes + lVar6);
      testing::ScopedTrace::ScopedTrace<testing::Message>
                (&gtest_trace_1184,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                 ,0x4a0,message);
      if (input.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream != (_func_int **)0x0) {
        (**(code **)(*input.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream + 8))();
      }
      TestInputStream::TestInputStream
                (&input,(void *)(&io::(anonymous_namespace)::kErrorCases)[lVar4 * 6],
                 (&DAT_01722e08)[lVar4 * 0xc],(&io::(anonymous_namespace)::kBlockSizes)[lVar6]);
      error_collector.super_ErrorCollector._vptr_ErrorCollector =
           (_func_int **)&PTR__TestErrorCollector_01667dd8;
      error_collector.text_._M_dataplus._M_p = (pointer)&error_collector.text_.field_2;
      error_collector.text_._M_string_length = 0;
      error_collector.text_.field_2._M_local_buf[0] = '\0';
      Tokenizer::Tokenizer
                (&tokenizer,&input.super_ZeroCopyInputStream,&error_collector.super_ErrorCollector);
      bVar3 = false;
      while( true ) {
        bVar2 = Tokenizer::Next(&tokenizer);
        if (!bVar2) break;
        bVar3 = std::operator==(&tokenizer.current_.text,"foo");
      }
      ppcVar5 = (char **)(&DAT_01722e28 + lVar4 * 0x30);
      testing::internal::CmpHelperEQ<char_const*,std::__cxx11::string>
                ((internal *)&gtest_ar,"kErrorCases_case.errors","error_collector.text_",
                 (char **)(&DAT_01722e28 + lVar4 * 0x30),&error_collector.text_);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        message_00 = anon_var_dwarf_651463 + 5;
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          message_00 = *(char **)gtest_ar.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl;
        }
        ppcVar5 = (char **)0x4ae;
        testing::internal::AssertHelper::AssertHelper
                  (&local_1a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0x4ae,message_00);
        testing::internal::AssertHelper::operator=(&local_1a0,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper(&local_1a0);
        if ((long *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_) + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      if ((&DAT_01722e20)[lVar4 * 0x30] == '\x01') {
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar_.success_ = bVar3;
        if (bVar3 == false) {
          testing::Message::Message((Message *)&local_1a0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"last_was_foo",
                     "false","true",in_R9);
          ppcVar5 = (char **)0x4b2;
          testing::internal::AssertHelper::AssertHelper
                    (&local_120,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                     ,0x4b2,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
          testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_1a0);
          testing::internal::AssertHelper::~AssertHelper(&local_120);
          std::__cxx11::string::~string((string *)&gtest_ar);
          if (local_1a0.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_1a0.data_ + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
      }
      Tokenizer::~Tokenizer(&tokenizer);
      TestErrorCollector::~TestErrorCollector(&error_collector);
      testing::ScopedTrace::~ScopedTrace(&gtest_trace_1184);
    }
  }
  return;
}

Assistant:

TEST_2D(TokenizerTest, Errors, kErrorCases, kBlockSizes) {
  // Set up the tokenizer.
  TestInputStream input(kErrorCases_case.input.data(),
                        kErrorCases_case.input.size(), kBlockSizes_case);
  TestErrorCollector error_collector;
  Tokenizer tokenizer(&input, &error_collector);

  // Ignore all input, except remember if the last token was "foo".
  bool last_was_foo = false;
  while (tokenizer.Next()) {
    last_was_foo = tokenizer.current().text == "foo";
  }

  // Check that the errors match what was expected.
  EXPECT_EQ(kErrorCases_case.errors, error_collector.text_);

  // If the error was recoverable, make sure we saw "foo" after it.
  if (kErrorCases_case.recoverable) {
    EXPECT_TRUE(last_was_foo);
  }
}